

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

DTLSSentRecord * __thiscall
bssl::InplaceVector<bssl::DTLSSentRecord,_32UL>::TryPushBack
          (InplaceVector<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord val)

{
  size_t sVar1;
  size_t sVar2;
  DTLSSentRecord *pDVar3;
  DTLSSentRecord *ret;
  InplaceVector<bssl::DTLSSentRecord,_32UL> *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity();
  if (sVar1 < sVar2) {
    pDVar3 = data(this);
    this_local = (InplaceVector<bssl::DTLSSentRecord,_32UL> *)(pDVar3 + this->size_);
    ((DTLSRecordNumber *)this_local->storage_)->combined_ = val.number.combined_;
    ((DTLSRecordNumber *)this_local->storage_)[1] = (DTLSRecordNumber)val._8_8_;
    ((DTLSRecordNumber *)this_local->storage_)[2] = (DTLSRecordNumber)val._16_8_;
    this->size_ = this->size_ + '\x01';
  }
  else {
    this_local = (InplaceVector<bssl::DTLSSentRecord,_32UL> *)0x0;
  }
  return (DTLSSentRecord *)this_local;
}

Assistant:

[[nodiscard]] T *TryPushBack(T val) {
    if (size() >= capacity()) {
      return nullptr;
    }
    T *ret = &data()[size_];
    new (ret) T(std::move(val));
    size_++;
    return ret;
  }